

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ExtractAlphaRows(VP8LDecoder *dec,int last_row)

{
  uint32_t *rows;
  int iVar1;
  VP8LDecoder *dec_00;
  uint8_t *puVar2;
  int in_ESI;
  long in_RDI;
  uint32_t *src;
  uint8_t *dst;
  int cache_pixs;
  int width;
  uint8_t *output;
  ALPHDecoder *alph_dec;
  int num_rows_to_process;
  uint32_t *in;
  int num_rows;
  int cur_row;
  int start_row;
  uint32_t *out;
  int iVar3;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  int local_14;
  int local_10;
  
  local_10 = *(int *)(in_RDI + 0x8c);
  dec_00 = (VP8LDecoder *)
           (*(long *)(in_RDI + 0x18) + (long)(*(int *)(in_RDI + 0x84) * local_10) * 4);
  for (local_14 = in_ESI - local_10; 0 < local_14; local_14 = local_14 - iVar4) {
    start_row = local_14;
    if (0x10 < local_14) {
      start_row = 0x10;
    }
    rows = *(uint32_t **)(*(long *)(in_RDI + 8) + 0x38);
    iVar3 = **(int **)(in_RDI + 8);
    iVar1 = iVar3 * start_row;
    puVar2 = (uint8_t *)(*(long *)(rows + 0x32) + (long)(iVar3 * local_10));
    out = *(uint32_t **)(in_RDI + 0x20);
    iVar4 = start_row;
    ApplyInverseTransforms(dec_00,start_row,in_stack_ffffffffffffffd8,rows);
    (*WebPExtractGreen)(out,puVar2,iVar1);
    AlphaApplyFilter((ALPHDecoder *)CONCAT44(iVar3,iVar1),(int)((ulong)puVar2 >> 0x20),(int)puVar2,
                     (uint8_t *)out,start_row);
    dec_00 = (VP8LDecoder *)(&dec_00->status_ + iVar4 * *(int *)(in_RDI + 0x84));
    local_10 = iVar4 + local_10;
  }
  *(int *)(in_RDI + 0x94) = in_ESI;
  *(int *)(in_RDI + 0x8c) = in_ESI;
  return;
}

Assistant:

static void ExtractAlphaRows(VP8LDecoder* const dec, int last_row) {
  int cur_row = dec->last_row_;
  int num_rows = last_row - cur_row;
  const uint32_t* in = dec->pixels_ + dec->width_ * cur_row;

  assert(last_row <= dec->io_->crop_bottom);
  while (num_rows > 0) {
    const int num_rows_to_process =
        (num_rows > NUM_ARGB_CACHE_ROWS) ? NUM_ARGB_CACHE_ROWS : num_rows;
    // Extract alpha (which is stored in the green plane).
    ALPHDecoder* const alph_dec = (ALPHDecoder*)dec->io_->opaque;
    uint8_t* const output = alph_dec->output_;
    const int width = dec->io_->width;      // the final width (!= dec->width_)
    const int cache_pixs = width * num_rows_to_process;
    uint8_t* const dst = output + width * cur_row;
    const uint32_t* const src = dec->argb_cache_;
    ApplyInverseTransforms(dec, cur_row, num_rows_to_process, in);
    WebPExtractGreen(src, dst, cache_pixs);
    AlphaApplyFilter(alph_dec,
                     cur_row, cur_row + num_rows_to_process, dst, width);
    num_rows -= num_rows_to_process;
    in += num_rows_to_process * dec->width_;
    cur_row += num_rows_to_process;
  }
  assert(cur_row == last_row);
  dec->last_row_ = dec->last_out_row_ = last_row;
}